

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void integer_suite::test_minus_hundred(void)

{
  char input [5];
  decoder_type decoder;
  undefined4 local_174;
  value_type local_170 [8];
  long local_168;
  basic_decoder<char> local_160;
  
  local_160.input.tail = local_170 + 4;
  builtin_memcpy(local_170,"-100",5);
  local_160.input.head = local_170;
  memset(&local_160.current,0,0x120);
  local_160.current.code = uninitialized;
  local_160.current.view.head = (const_pointer)0x0;
  local_160.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_160);
  local_168 = CONCAT44(local_168._4_4_,local_160.current.code);
  local_174 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1aa,"void integer_suite::test_minus_hundred()",&local_168,&local_174);
  local_168 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long>(&local_160);
  local_174 = 0xffffff9c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("decoder.signed_value<std::int64_t>()","-100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ab,"void integer_suite::test_minus_hundred()",&local_168,&local_174);
  if (error_unexpected_token < local_160.current.code) {
    if (local_160.current.code == end) {
      local_160.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_160);
    }
  }
  local_168 = CONCAT44(local_168._4_4_,local_160.current.code);
  local_174 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ad,"void integer_suite::test_minus_hundred()",&local_168,&local_174);
  return;
}

Assistant:

void test_minus_hundred()
{
    const char input[] = "-100";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<std::int64_t>(), -100);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}